

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O3

void __thiscall Fl_Help_Dialog::textsize(Fl_Help_Dialog *this,Fl_Fontsize s)

{
  Fl_Help_View *this_00;
  
  this_00 = this->view_;
  this_00->textsize_ = s;
  Fl_Help_View::format(this_00);
  if (s < 9) {
    Fl_Widget::deactivate(&this->smaller_->super_Fl_Widget);
  }
  else {
    Fl_Widget::activate(&this->smaller_->super_Fl_Widget);
    if (0x11 < (uint)s) {
      Fl_Widget::deactivate(&this->larger_->super_Fl_Widget);
      return;
    }
  }
  Fl_Widget::activate(&this->larger_->super_Fl_Widget);
  return;
}

Assistant:

void Fl_Help_Dialog::textsize(Fl_Fontsize s) {
  view_->textsize(s);
  
  if (s <= 8)
    smaller_->deactivate();
  else
    smaller_->activate();
  
  if (s >= 18)
    larger_->deactivate();
  else
    larger_->activate();
}